

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,uint c)

{
  int *piVar1;
  unsigned_short *puVar2;
  int iVar3;
  unsigned_short *__dest;
  int iVar4;
  int iVar5;
  
  if (c - 1 < 0xffff) {
    iVar3 = (this->InputQueueCharacters).Size;
    if (iVar3 == (this->InputQueueCharacters).Capacity) {
      if (iVar3 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar3 / 2 + iVar3;
      }
      iVar5 = iVar3 + 1;
      if (iVar3 + 1 < iVar4) {
        iVar5 = iVar4;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)(*GImAllocatorAllocFunc)((long)iVar5 * 2,GImAllocatorUserData);
      puVar2 = (this->InputQueueCharacters).Data;
      if (puVar2 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar2,(long)(this->InputQueueCharacters).Size * 2);
        puVar2 = (this->InputQueueCharacters).Data;
        if ((puVar2 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
      }
      (this->InputQueueCharacters).Data = __dest;
      (this->InputQueueCharacters).Capacity = iVar5;
      iVar3 = (this->InputQueueCharacters).Size;
    }
    else {
      __dest = (this->InputQueueCharacters).Data;
    }
    __dest[iVar3] = (unsigned_short)c;
    (this->InputQueueCharacters).Size = (this->InputQueueCharacters).Size + 1;
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(unsigned int c)
{
    if (c > 0 && c <= IM_UNICODE_CODEPOINT_MAX)
        InputQueueCharacters.push_back((ImWchar)c);
}